

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_from_stream.cc
# Opt level: O0

bool __thiscall
sptk::InputSourceFromStream::Get
          (InputSourceFromStream *this,vector<double,_std::allocator<double>_> *buffer)

{
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  int in_stack_00000028;
  int in_stack_0000002c;
  int in_stack_00000030;
  bool in_stack_00000036;
  int *in_stack_00000040;
  undefined1 local_1;
  
  if ((in_RSI == 0) || ((*(byte *)(in_RDI + 0x18) & 1) == 0)) {
    local_1 = false;
  }
  else {
    local_1 = ReadStream<double>(in_stack_00000036,in_stack_00000030,in_stack_0000002c,
                                 in_stack_00000028,in_stack_00000020,(istream *)this,
                                 in_stack_00000040);
  }
  return local_1;
}

Assistant:

bool InputSourceFromStream::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }
  return sptk::ReadStream(zero_padding_, 0, 0, read_size_, buffer,
                          input_stream_, NULL);
}